

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O3

UINT8 device_start_c140(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  undefined1 auVar1 [16];
  c140_state *info;
  DEV_DATA DVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar11;
  uint uVar12;
  uint uVar14;
  undefined1 auVar6 [16];
  int iVar13;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar21;
  uint uVar22;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar23;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar24;
  uint uVar26;
  uint uVar27;
  uint uVar29;
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar45;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar52;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  undefined1 auVar53 [16];
  uint uVar59;
  uint uVar60;
  uint uVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  long lVar28;
  
  DVar2.chipInf = calloc(1,0x788);
  if (DVar2.chipInf == (void *)0x0) {
    return 0xff;
  }
  uVar24 = cfg->clock;
  *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 8))->chipInf = uVar24;
  uVar3 = uVar24 / 0x120;
  *(uint *)((long)DVar2.chipInf + 0xc) = uVar24 / 0x120;
  if (cfg->srMode == '\x02') {
    uVar26 = cfg->smplRate;
    if (uVar26 <= uVar24 / 0x120) goto LAB_00168d13;
  }
  else {
    if (cfg->srMode != '\x01') goto LAB_00168d13;
    uVar26 = cfg->smplRate;
  }
  *(uint *)((long)DVar2.chipInf + 0xc) = uVar26;
  uVar3 = uVar26;
LAB_00168d13:
  *(float *)&((DEV_DATA *)((long)DVar2.chipInf + 0x10))->chipInf =
       ((float)uVar24 / 288.0) / (float)uVar3;
  *(UINT8 *)((long)DVar2.chipInf + 0x14) = cfg->flags;
  uVar5 = 4;
  uVar11 = 5;
  uVar12 = 6;
  uVar14 = 7;
  iVar45 = 0;
  uVar21 = 1;
  uVar22 = 2;
  uVar23 = 3;
  lVar4 = 0x114;
  auVar6 = _DAT_0017a2a0;
  auVar32 = _DAT_0017a2b0;
  auVar34 = _DAT_001733e0;
  auVar35 = _DAT_001733c0;
  uVar24 = uVar5;
  uVar26 = uVar11;
  uVar27 = uVar12;
  uVar29 = uVar14;
  uVar49 = uVar21;
  uVar50 = uVar22;
  uVar51 = uVar23;
  do {
    auVar1 = _DAT_001733d0;
    uVar59 = uVar21 & 7;
    uVar60 = uVar22 & 7;
    uVar61 = uVar23 & 7;
    uVar52 = uVar5 & 7;
    uVar54 = uVar11 & 7;
    uVar55 = uVar12 & 7;
    uVar56 = uVar14 & 7;
    uVar37 = (int)(uVar24 << 0x18) >> 0x1f;
    uVar42 = (int)(uVar26 << 0x18) >> 0x1f;
    uVar43 = (int)(uVar27 << 0x18) >> 0x1f;
    uVar44 = (int)(uVar29 << 0x18) >> 0x1f;
    auVar66._0_4_ = ((int)(uVar24 << 0x18) >> 0x1b ^ uVar37) - uVar37;
    auVar66._4_4_ = ((int)(uVar26 << 0x18) >> 0x1b ^ uVar42) - uVar42;
    auVar66._8_4_ = ((int)(uVar27 << 0x18) >> 0x1b ^ uVar43) - uVar43;
    auVar66._12_4_ = ((int)(uVar29 << 0x18) >> 0x1b ^ uVar44) - uVar44;
    uVar37 = (iVar45 << 0x18) >> 0x1f;
    uVar42 = (int)(uVar49 << 0x18) >> 0x1f;
    uVar43 = (int)(uVar50 << 0x18) >> 0x1f;
    uVar44 = (int)(uVar51 << 0x18) >> 0x1f;
    auVar69._0_4_ = ((iVar45 << 0x18) >> 0x1b ^ uVar37) - uVar37;
    auVar69._4_4_ = ((int)(uVar49 << 0x18) >> 0x1b ^ uVar42) - uVar42;
    auVar69._8_4_ = ((int)(uVar50 << 0x18) >> 0x1b ^ uVar43) - uVar43;
    auVar69._12_4_ = ((int)(uVar51 << 0x18) >> 0x1b ^ uVar44) - uVar44;
    auVar71._0_4_ = (int)(float)(uVar52 * 0x800000 + 0x3f800000);
    auVar71._4_4_ = (int)(float)(uVar54 * 0x800000 + 0x3f800000);
    auVar71._8_4_ = (int)(float)(uVar55 * 0x800000 + 0x3f800000);
    auVar71._12_4_ = (int)(float)(uVar56 * 0x800000 + 0x3f800000);
    auVar62._4_4_ = auVar71._4_4_;
    auVar62._0_4_ = auVar71._4_4_;
    auVar62._8_4_ = auVar71._12_4_;
    auVar62._12_4_ = auVar71._12_4_;
    auVar38._4_4_ = (int)(float)(uVar59 * 0x800000 + 0x3f800000);
    auVar38._0_4_ = 1;
    auVar38._8_4_ = (int)(float)(uVar60 * 0x800000 + 0x3f800000);
    auVar38._12_4_ = (int)(float)(uVar61 * 0x800000 + 0x3f800000);
    auVar63._4_4_ = auVar38._4_4_;
    auVar63._0_4_ = auVar38._4_4_;
    auVar63._8_4_ = auVar38._12_4_;
    auVar63._12_4_ = auVar38._12_4_;
    auVar15._4_4_ =
         (int)(float)((-(uint)(uVar59 == 0) & 4 | ~-(uint)(uVar59 == 0) & uVar59 + 3) * 0x800000 +
                     0x3f800000);
    auVar15._12_4_ =
         (int)(float)((-(uint)(uVar61 == 0) & 4 | ~-(uint)(uVar61 == 0) & uVar61 + 3) * 0x800000 +
                     0x3f800000);
    auVar15._0_4_ = auVar15._4_4_;
    auVar15._8_4_ = auVar15._12_4_;
    auVar58._4_4_ =
         (int)(float)((-(uint)(uVar54 == 0) & 4 | ~-(uint)(uVar54 == 0) & uVar54 + 3) * 0x800000 +
                     0x3f800000);
    auVar58._12_4_ =
         (int)(float)((-(uint)(uVar56 == 0) & 4 | ~-(uint)(uVar56 == 0) & uVar56 + 3) * 0x800000 +
                     0x3f800000);
    auVar58._0_4_ = auVar58._4_4_;
    auVar58._8_4_ = auVar58._12_4_;
    auVar70._0_4_ = auVar69._0_4_ * 0x100000 >> 0x10;
    auVar70._4_4_ =
         (int)((auVar15._4_4_ * auVar69._4_4_ + (auVar38._4_4_ * 0x80 & 0x7f00U)) * 0x10000) >> 0x10
    ;
    auVar70._8_4_ =
         (int)(((int)((auVar69._8_8_ & 0xffffffff) *
                     (ulong)(uint)(int)(float)((-(uint)(uVar60 == 0) & 4 |
                                               ~-(uint)(uVar60 == 0) & uVar60 + 3) * 0x800000 +
                                              0x3f800000)) +
               ((uint)((auVar38._8_8_ & 0xffffffff) * 0x80) & 0x7f00)) * 0x10000) >> 0x10;
    auVar70._12_4_ =
         (int)(((int)((auVar15._8_8_ & 0xffffffff) * (ulong)auVar69._12_4_) +
               ((uint)((auVar63._8_8_ & 0xffffffff) * 0x80) & 0x7f00)) * 0x10000) >> 0x10;
    auVar53._0_4_ =
         (int)((auVar66._0_4_ *
                (int)(float)((-(uint)(uVar52 == 0) & 4 | ~-(uint)(uVar52 == 0) & uVar52 + 3) *
                             0x800000 + 0x3f800000) + (auVar71._0_4_ * 0x80 & 0x7f00U)) * 0x10000)
         >> 0x10;
    auVar53._4_4_ =
         (int)((auVar58._4_4_ * auVar66._4_4_ + (auVar71._4_4_ * 0x80 & 0x7f00U)) * 0x10000) >> 0x10
    ;
    auVar53._8_4_ =
         (int)(((int)((auVar66._8_8_ & 0xffffffff) *
                     (ulong)(uint)(int)(float)((-(uint)(uVar55 == 0) & 4 |
                                               ~-(uint)(uVar55 == 0) & uVar55 + 3) * 0x800000 +
                                              0x3f800000)) +
               ((uint)((auVar71._8_8_ & 0xffffffff) * 0x80) & 0x7f00)) * 0x10000) >> 0x10;
    auVar53._12_4_ =
         (int)(((int)((auVar58._8_8_ & 0xffffffff) * (ulong)auVar66._12_4_) +
               ((uint)((auVar62._8_8_ & 0xffffffff) * 0x80) & 0x7f00)) * 0x10000) >> 0x10;
    auVar71 = packssdw(auVar70,auVar53);
    auVar15 = auVar35 ^ _DAT_001733d0;
    auVar64._0_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar64._4_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar64._8_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar64._12_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar57._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar57._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar57._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar57._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar15 = auVar34 ^ _DAT_001733d0;
    auVar67._0_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar67._4_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar67._8_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar67._12_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar16._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar58 = packssdw(auVar57 & auVar64,auVar16 & auVar67);
    auVar15 = auVar32 ^ _DAT_001733d0;
    auVar68._0_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar68._4_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar68._8_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar68._12_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar17._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar15 = auVar6 ^ _DAT_001733d0;
    auVar39._0_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar39._4_4_ = -(uint)(auVar15._0_4_ < -0x7fffff80);
    auVar39._8_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar39._12_4_ = -(uint)(auVar15._8_4_ < -0x7fffff80);
    auVar65._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar65._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar65._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar65._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar15 = packssdw(auVar17 & auVar68,auVar65 & auVar39);
    auVar58 = packssdw(auVar58,auVar15);
    auVar15 = auVar71 & _DAT_0017d4e0;
    auVar40._2_2_ = -auVar15._2_2_;
    auVar40._0_2_ = -auVar15._0_2_;
    auVar40._4_2_ = -auVar15._4_2_;
    auVar40._6_2_ = -auVar15._6_2_;
    auVar40._8_2_ = -auVar15._8_2_;
    auVar40._10_2_ = -auVar15._10_2_;
    auVar40._12_2_ = -auVar15._12_2_;
    auVar40._14_2_ = -auVar15._14_2_;
    *(undefined1 (*) [16])((long)DVar2.chipInf + lVar4 * 2) = ~auVar58 & auVar40 | auVar71 & auVar58
    ;
    lVar28 = auVar35._8_8_;
    auVar35._0_8_ = auVar35._0_8_ + 8;
    auVar35._8_8_ = lVar28 + 8;
    lVar28 = auVar34._8_8_;
    auVar34._0_8_ = auVar34._0_8_ + 8;
    auVar34._8_8_ = lVar28 + 8;
    lVar28 = auVar32._8_8_;
    auVar32._0_8_ = auVar32._0_8_ + 8;
    auVar32._8_8_ = lVar28 + 8;
    lVar28 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 8;
    auVar6._8_8_ = lVar28 + 8;
    uVar21 = uVar21 + 8;
    uVar22 = uVar22 + 8;
    uVar23 = uVar23 + 8;
    uVar5 = uVar5 + 8;
    uVar11 = uVar11 + 8;
    uVar12 = uVar12 + 8;
    uVar14 = uVar14 + 8;
    iVar45 = iVar45 + 8;
    uVar49 = uVar49 + 8;
    uVar50 = uVar50 + 8;
    uVar51 = uVar51 + 8;
    uVar24 = uVar24 + 8;
    uVar26 = uVar26 + 8;
    uVar27 = uVar27 + 8;
    uVar29 = uVar29 + 8;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x214);
  lVar4 = 0x449;
  auVar25 = _DAT_0017a2a0;
  auVar30 = _DAT_0017a2b0;
  auVar31 = _DAT_001733e0;
  auVar33 = _DAT_001733c0;
  do {
    auVar6 = auVar33 ^ auVar1;
    iVar45 = auVar6._0_4_;
    iVar13 = auVar6._8_4_;
    auVar18._4_4_ = iVar45;
    auVar18._0_4_ = iVar45;
    auVar18._8_4_ = iVar13;
    auVar18._12_4_ = iVar13;
    auVar46._0_4_ = -(uint)(iVar45 < -0x7fffffe8);
    auVar46._4_4_ = -(uint)(iVar45 < -0x7fffffe8);
    auVar46._8_4_ = -(uint)(iVar13 < -0x7fffffe8);
    auVar46._12_4_ = -(uint)(iVar13 < -0x7fffffe8);
    auVar7._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar7._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar7._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar7._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar7 = auVar7 & auVar46;
    auVar6 = pshuflw(auVar18,auVar7,0xe8);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4) = 0;
    }
    auVar6 = packssdw(auVar7,auVar7);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6._0_4_ >> 0x10 & 1) != 0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4 + 0x24) = 0;
    }
    auVar6 = auVar31 ^ auVar1;
    iVar45 = auVar6._0_4_;
    iVar13 = auVar6._8_4_;
    auVar19._4_4_ = iVar45;
    auVar19._0_4_ = iVar45;
    auVar19._8_4_ = iVar13;
    auVar19._12_4_ = iVar13;
    auVar47._0_4_ = -(uint)(iVar45 < -0x7fffffe8);
    auVar47._4_4_ = -(uint)(iVar45 < -0x7fffffe8);
    auVar47._8_4_ = -(uint)(iVar13 < -0x7fffffe8);
    auVar47._12_4_ = -(uint)(iVar13 < -0x7fffffe8);
    auVar8._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar8._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar8._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar8._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar8 = auVar8 & auVar47;
    auVar6 = packssdw(auVar19,auVar8);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4 + 0x48) = 0;
    }
    auVar6 = pshufhw(auVar8,auVar8,0x84);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4 + 0x6c) = 0;
    }
    auVar6 = auVar30 ^ auVar1;
    iVar45 = auVar6._0_4_;
    iVar13 = auVar6._8_4_;
    auVar20._4_4_ = iVar45;
    auVar20._0_4_ = iVar45;
    auVar20._8_4_ = iVar13;
    auVar20._12_4_ = iVar13;
    auVar48._0_4_ = -(uint)(iVar45 < -0x7fffffe8);
    auVar48._4_4_ = -(uint)(iVar45 < -0x7fffffe8);
    auVar48._8_4_ = -(uint)(iVar13 < -0x7fffffe8);
    auVar48._12_4_ = -(uint)(iVar13 < -0x7fffffe8);
    auVar9._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar9._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar9._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar9._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar9 = auVar9 & auVar48;
    auVar6 = pshuflw(auVar20,auVar9,0xe8);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4 + 0x90) = 0;
    }
    auVar6 = packssdw(auVar9,auVar9);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4 + 0xb4) = 0;
    }
    auVar6 = auVar25 ^ auVar1;
    auVar10._4_4_ = auVar6._4_4_;
    auVar10._12_4_ = auVar6._12_4_;
    auVar41._0_4_ = -(uint)(auVar6._0_4_ < -0x7fffffe8);
    auVar41._4_4_ = -(uint)(auVar6._0_4_ < -0x7fffffe8);
    auVar41._8_4_ = -(uint)(auVar6._8_4_ < -0x7fffffe8);
    auVar41._12_4_ = -(uint)(auVar6._8_4_ < -0x7fffffe8);
    auVar10._0_4_ = auVar10._4_4_;
    auVar10._8_4_ = auVar10._12_4_;
    auVar36._0_4_ = -(uint)(auVar10._4_4_ == -0x80000000);
    auVar36._4_4_ = -(uint)(auVar10._4_4_ == -0x80000000);
    auVar36._8_4_ = -(uint)(auVar10._12_4_ == -0x80000000);
    auVar36._12_4_ = -(uint)(auVar10._12_4_ == -0x80000000);
    auVar6 = packssdw(auVar10,auVar36 & auVar41);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4 + 0xd8) = 0;
    }
    auVar6 = pshufhw(auVar6,auVar36 & auVar41,0x84);
    auVar6 = packssdw(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)DVar2.chipInf + lVar4 + 0xfc) = 0;
    }
    lVar28 = auVar33._8_8_;
    auVar33._0_8_ = auVar33._0_8_ + 8;
    auVar33._8_8_ = lVar28 + 8;
    lVar28 = auVar31._8_8_;
    auVar31._0_8_ = auVar31._0_8_ + 8;
    auVar31._8_8_ = lVar28 + 8;
    lVar28 = auVar30._8_8_;
    auVar30._0_8_ = auVar30._0_8_ + 8;
    auVar30._8_8_ = lVar28 + 8;
    lVar28 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 8;
    auVar25._8_8_ = lVar28 + 8;
    lVar4 = lVar4 + 0x120;
  } while (lVar4 != 0x7a9);
  *(void **)DVar2.chipInf = DVar2.chipInf;
  retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
  retDevInf->sampleRate = uVar3;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_c140(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	c140_state *info;
	int i;

	info = (c140_state *)calloc(1, sizeof(c140_state));
	if (info == NULL)
		return 0xFF;
	
	info->clock = cfg->clock;
	info->sample_rate = info->clock / 288;	// sample rate according to superctr
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->sample_rate, cfg->smplRate);
	info->pbase = (float)info->clock / 288.0f / (float)info->sample_rate;

	info->banking_type = cfg->flags;

	info->pRomSize = 0x00;
	info->pRom = NULL;

	for(i = 0; i < 256; i++)
	{
		UINT8 s1 = i & 7;
		UINT8 s2 = abs((INT8)i >> 3) & 0x1F;
		info->mulaw_table[i]  = (0x80 << s1) & 0xFF00;
		info->mulaw_table[i] += s2 << (s1 ? (s1+3) : 4);
		if (i & 0x80)
			info->mulaw_table[i] = -info->mulaw_table[i];
	}

	c140_set_mute_mask(info, 0x000000);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->sample_rate, &devDef);
	return 0x00;
}